

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O3

void PatchRandoWorldEdits::put_back_giants_in_verla_mines_keydoor_map(World *world)

{
  Map *this;
  pointer pGVar1;
  mapped_type *ppMVar2;
  key_type local_a;
  
  local_a = 0xe4;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,&local_a);
  this = *ppMVar2;
  pGVar1 = (this->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_global_entity_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar1) {
    (this->_global_entity_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  pGVar1 = (this->_key_door_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_key_door_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar1) {
    (this->_key_door_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  Map::remove_entity(this,'\x01',true);
  Map::remove_entity(this,'\0',true);
  return;
}

Assistant:

static void put_back_giants_in_verla_mines_keydoor_map(World& world)
    {
        Map* map = world.map(MAP_VERLA_MINES_KEYDOOR_NEAR_ENTRANCE);
        map->global_entity_mask_flags().clear();
        map->key_door_mask_flags().clear();
        // Remove the keydoor and an invisible cube
        map->remove_entity(1);
        map->remove_entity(0);
    }